

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall
Equality_variableEqualAllTestedConditionsVariant1_Test::TestBody
          (Equality_variableEqualAllTestedConditionsVariant1_Test *this)

{
  byte bVar1;
  string *psVar2;
  char cVar3;
  AssertionResult gtest_ar_;
  VariablePtr v2;
  VariablePtr v1;
  AssertionResult local_70;
  long local_60 [2];
  long *local_50;
  AssertHelper local_48 [8];
  byte local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  libcellml::Variable::create();
  libcellml::Variable::create();
  psVar2 = local_20;
  local_70._0_8_ = (string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"variable","");
  libcellml::NamedEntity::setName(psVar2);
  if ((string *)local_70._0_8_ != (string *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60[0] + 1);
  }
  psVar2 = local_30;
  local_70._0_8_ = (string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"variable","");
  libcellml::NamedEntity::setName(psVar2);
  if ((string *)local_70._0_8_ != (string *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60[0] + 1);
  }
  libcellml::Variable::setInitialValue(3.0);
  psVar2 = local_30;
  local_70._0_8_ = (string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"3","");
  libcellml::Variable::setInitialValue(psVar2);
  if ((string *)local_70._0_8_ != (string *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60[0] + 1);
  }
  libcellml::Variable::setInterfaceType((InterfaceType)local_20);
  libcellml::Variable::setInterfaceType((InterfaceType)local_30);
  psVar2 = local_20;
  local_70._0_8_ = (string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ampere","");
  libcellml::Variable::setUnits(psVar2);
  if ((string *)local_70._0_8_ != (string *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60[0] + 1);
  }
  psVar2 = local_30;
  local_70._0_8_ = (string *)local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"ampere","");
  libcellml::Variable::setUnits(psVar2);
  if ((string *)local_70._0_8_ != (string *)local_60) {
    operator_delete((void *)local_70._0_8_,local_60[0] + 1);
  }
  local_70._0_8_ = local_30;
  local_70.message_.ptr_ = local_28;
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_28->_M_string_length = (int)local_28->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_28->_M_string_length = (int)local_28->_M_string_length + 1;
    }
  }
  local_40[0] = libcellml::Entity::equals((shared_ptr *)local_20);
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar1 = local_40[0];
  if (local_70.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.message_.ptr_);
    bVar1 = local_40[0] & 1;
  }
  if (bVar1 == 0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(char *)local_40,"v1->equals(v2)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,100,(char *)local_70._0_8_);
    testing::internal::AssertHelper::operator=(local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    if ((string *)local_70._0_8_ != (string *)local_60) {
      operator_delete((void *)local_70._0_8_,local_60[0] + 1);
    }
    if (((local_50 != (long *)0x0) && (cVar3 = testing::internal::IsTrue(true), cVar3 != '\0')) &&
       (local_50 != (long *)0x0)) {
      (**(code **)(*local_50 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70._0_8_ = local_20;
  local_70.message_.ptr_ = local_18;
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_18->_M_string_length = (int)local_18->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_18->_M_string_length = (int)local_18->_M_string_length + 1;
    }
  }
  local_40[0] = libcellml::Entity::equals((shared_ptr *)local_30);
  local_38.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  bVar1 = local_40[0];
  if (local_70.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.message_.ptr_);
    bVar1 = local_40[0] & 1;
  }
  if (bVar1 == 0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(char *)local_40,"v2->equals(v1)","false");
    testing::internal::AssertHelper::AssertHelper
              (local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x65,(char *)local_70._0_8_);
    testing::internal::AssertHelper::operator=(local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(local_48);
    if ((string *)local_70._0_8_ != (string *)local_60) {
      operator_delete((void *)local_70._0_8_,local_60[0] + 1);
    }
    if (((local_50 != (long *)0x0) && (cVar3 = testing::internal::IsTrue(true), cVar3 != '\0')) &&
       (local_50 != (long *)0x0)) {
      (**(code **)(*local_50 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_28 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
  }
  if (local_18 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18);
  }
  return;
}

Assistant:

TEST(Equality, variableEqualAllTestedConditionsVariant1)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();

    v1->setName("variable");
    v2->setName("variable");

    v1->setInitialValue(3.0);
    v2->setInitialValue("3");

    v1->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC);
    v2->setInterfaceType(libcellml::Variable::InterfaceType::PUBLIC);

    v1->setUnits("ampere");
    v2->setUnits("ampere");

    EXPECT_TRUE(v1->equals(v2));
    EXPECT_TRUE(v2->equals(v1));
}